

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
* chipemu::implementation::create_nodes
            (pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             *__return_storage_ptr__,
            vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            *cnodes)

{
  pointer *ppuVar1;
  transdef *tdef_00;
  ushort uVar2;
  unsigned_short uVar3;
  uint16_t uVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_type sVar8;
  construct_node *pcVar9;
  unsigned_short *puVar10;
  reference pvVar11;
  const_reference pvVar12;
  uint16_t *puVar13;
  const_reference pptVar14;
  uint16_t gn_off;
  value_type tdef;
  uint16_t i_2;
  uint16_t *connectors;
  uint16_t *node_1;
  construct_node *cnode_1;
  uint16_t nodei_1;
  uint16_t *puStack_80;
  uint16_t i_1;
  uint16_t *leg;
  uint16_t *node;
  construct_node *cnode;
  uint16_t nodei;
  ushort local_5e;
  uint16_t i;
  value_type local_4a;
  undefined1 local_48 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> node_offsets;
  vector<unsigned_short,_std::allocator<unsigned_short>_> nodes;
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  *cnodes_local;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48);
  local_4a = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,&local_4a);
  local_5e = 1;
  while( true ) {
    uVar5 = (ulong)local_5e;
    sVar6 = std::
            vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ::size(cnodes);
    if (sVar6 <= uVar5) {
      cnode._0_2_ = 1;
      while( true ) {
        uVar5 = (ulong)(ushort)cnode;
        sVar6 = std::
                vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ::size(cnodes);
        if (sVar6 <= uVar5) break;
        pcVar9 = std::
                 vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                 ::data(cnodes);
        uVar2 = (ushort)cnode;
        puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &node_offsets.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,
                             (ulong)(ushort)cnode);
        puStack_80 = anon_unknown_0::node_gates(puVar10 + *pvVar11);
        cnode_1._6_2_ = 0;
        while( true ) {
          sVar6 = std::
                  vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                  ::size(&pcVar9[uVar2].gates);
          if (sVar6 <= cnode_1._6_2_) break;
          pvVar12 = std::
                    vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                    ::operator[](&pcVar9[uVar2].gates,(ulong)cnode_1._6_2_);
          puVar13 = puStack_80 + 1;
          *puStack_80 = pvVar12->c1 << 1;
          pvVar12 = std::
                    vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                    ::operator[](&pcVar9[uVar2].gates,(ulong)cnode_1._6_2_);
          puStack_80 = puStack_80 + 2;
          *puVar13 = pvVar12->c2 << 1;
          cnode_1._6_2_ = cnode_1._6_2_ + 1;
        }
        cnode._0_2_ = (ushort)cnode + 1;
      }
      cnode_1._4_2_ = 1;
      while( true ) {
        sVar6 = std::
                vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ::size(cnodes);
        if (sVar6 <= cnode_1._4_2_) break;
        pcVar9 = std::
                 vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                 ::data(cnodes);
        puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &node_offsets.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,
                             (ulong)cnode_1._4_2_);
        puVar13 = anon_unknown_0::node_sibling_connectors(puVar10 + *pvVar11);
        tdef._6_2_ = 0;
        while( true ) {
          sVar6 = std::
                  vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                  ::size(&pcVar9[cnode_1._4_2_].sibling_connectors);
          if (sVar6 <= tdef._6_2_) break;
          pptVar14 = std::
                     vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                     ::operator[](&pcVar9[cnode_1._4_2_].sibling_connectors,(ulong)tdef._6_2_);
          tdef_00 = *pptVar14;
          pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,
                               (ulong)tdef_00->gate);
          uVar4 = *pvVar11;
          puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                               &node_offsets.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar4 = anon_unknown_0::lookup_leg(puVar10,cnode_1._4_2_,uVar4,tdef_00);
          puVar13[tdef._6_2_] = uVar4;
          tdef._6_2_ = tdef._6_2_ + 1;
        }
        cnode_1._4_2_ = cnode_1._4_2_ + 1;
      }
      std::
      make_pair<std::vector<unsigned_short,std::allocator<unsigned_short>>&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
                (__return_storage_ptr__,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    uVar3 = std::numeric_limits<unsigned_short>::max();
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &node_offsets.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (uVar3 <= sVar6) break;
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &node_offsets.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    nodei = (uint16_t)sVar6;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,&nodei);
    pvVar7 = std::
             vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ::operator[](cnodes,(ulong)local_5e);
    cnode._6_2_ = pvVar7->is_pullup & 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&cnode + 6));
    pvVar7 = std::
             vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ::operator[](cnodes,(ulong)local_5e);
    sVar6 = std::
            vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
            ::size(&pvVar7->gates);
    cnode._4_2_ = (undefined2)sVar6;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&cnode + 4));
    pvVar7 = std::
             vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ::operator[](cnodes,(ulong)local_5e);
    sVar6 = std::
            vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ::size(&pvVar7->sibling_connectors);
    cnode._2_2_ = (undefined2)sVar6;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&cnode + 2));
    ppuVar1 = &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppuVar1);
    pvVar7 = std::
             vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ::operator[](cnodes,(ulong)local_5e);
    sVar8 = std::
            vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
            ::size(&pvVar7->gates);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppuVar1,sVar6 + sVar8 * 2)
    ;
    ppuVar1 = &node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppuVar1);
    pvVar7 = std::
             vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             ::operator[](cnodes,(ulong)local_5e);
    sVar8 = std::
            vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ::size(&pvVar7->sibling_connectors);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)ppuVar1,sVar6 + sVar8);
    local_5e = local_5e + 1;
  }
  __assert_fail("std::numeric_limits<uint16_t>::max() > nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GBuella[P]chipemu/src/nmos.cc"
                ,0x144,
                "pair<vector<uint16_t>, vector<uint16_t>> chipemu::implementation::create_nodes(const vector<construct_node> &)"
               );
}

Assistant:

static pair<vector<uint16_t>, vector<uint16_t>>
create_nodes(const vector<construct_node>& cnodes)
{
    vector<uint16_t> nodes;
    vector<uint16_t> node_offsets;

    node_offsets.push_back(0);
    for (uint16_t i = 1; i < cnodes.size(); ++i) {
        assert(std::numeric_limits<uint16_t>::max() > nodes.size());

        node_offsets.push_back(uint16_t(nodes.size()));
        nodes.push_back(cnodes[i].is_pullup ? node_is_pullup : 0);
        nodes.push_back(uint16_t(cnodes[i].gates.size()));
        nodes.push_back(uint16_t(cnodes[i].sibling_connectors.size()));
        nodes.resize(nodes.size() + cnodes[i].gates.size() * 2);
        nodes.resize(nodes.size() + cnodes[i].sibling_connectors.size());
    }
    for (uint16_t nodei = 1; nodei < cnodes.size(); ++nodei) {
        const construct_node *cnode = cnodes.data() + nodei;
        uint16_t *node = nodes.data() + node_offsets[nodei];
        uint16_t *leg = node_gates(node);
        for (uint16_t i = 0; i < cnode->gates.size(); ++i) {
            *leg++ = cnode->gates[i].c1 << 1;
            *leg++ = cnode->gates[i].c2 << 1;
        }
    }
    for (uint16_t nodei = 1; nodei < cnodes.size(); ++nodei) {
        const construct_node *cnode = cnodes.data() + nodei;
        uint16_t *node = nodes.data() + node_offsets[nodei];
        auto connectors = node_sibling_connectors(node);
        for (uint16_t i = 0; i < cnode->sibling_connectors.size(); ++i) {
            auto tdef = cnode->sibling_connectors[i];
            uint16_t gn_off = node_offsets[tdef->gate];
            connectors[i] = lookup_leg(nodes.data(), nodei, gn_off, tdef);
        }
    }

    return make_pair(node_offsets, nodes);
}